

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O3

int run_test_udp_send_unix(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *loop;
  uv_handle_t *handle_00;
  int64_t eval_b_4;
  int64_t eval_b_6;
  uv_buf_t buf;
  uv_udp_t handle;
  uv_udp_send_t req;
  undefined1 local_2a0 [16];
  uv_buf_t local_290;
  undefined1 local_27e [18];
  undefined8 local_26c;
  undefined8 uStack_264;
  undefined8 local_25c;
  undefined8 uStack_254;
  undefined8 local_24c;
  undefined8 uStack_244;
  undefined8 local_23c;
  undefined8 uStack_234;
  undefined8 local_22c;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined8 uStack_218;
  uv_udp_t local_210;
  uv_udp_send_t local_158;
  
  local_290 = uv_buf_init("PING",4);
  loop = uv_default_loop();
  uStack_264 = 0;
  local_25c = 0;
  uStack_254 = 0;
  local_24c = 0;
  uStack_244 = 0;
  local_23c = 0;
  uStack_234 = 0;
  local_22c = 0;
  uStack_224 = 0;
  uStack_220 = 0;
  uStack_21c = 0;
  uStack_218 = 0;
  local_27e._0_2_ = 1;
  local_158.data = (void *)0x11;
  local_210.data = (void *)0x6c;
  local_27e[2] = '/';
  local_27e[3] = 't';
  local_27e[4] = 'm';
  local_27e[5] = 'p';
  local_27e[6] = '/';
  local_27e[7] = 'u';
  local_27e[8] = 'v';
  local_27e[9] = '-';
  local_27e[10] = 't';
  local_27e[0xb] = 'e';
  local_27e[0xc] = 's';
  local_27e[0xd] = 't';
  local_27e[0xe] = '-';
  local_27e[0xf] = 's';
  local_27e[0x10] = 'o';
  local_27e[0x11] = 'c';
  local_26c = 0x6b;
  iVar1 = socket(1,1,0);
  local_158.data = (void *)(long)iVar1;
  local_210.data = (void *)0x0;
  if ((long)local_158.data < 0) {
    local_210.data = (void *)0x0;
    run_test_udp_send_unix_cold_8();
LAB_001dc780:
    run_test_udp_send_unix_cold_2();
LAB_001dc795:
    run_test_udp_send_unix_cold_3();
LAB_001dc7aa:
    run_test_udp_send_unix_cold_4();
LAB_001dc7bc:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    iVar2 = bind(iVar1,(sockaddr *)local_27e,0x6e);
    local_158.data = (void *)(long)iVar2;
    local_210.data = (void *)0x0;
    if (local_158.data != (void *)0x0) goto LAB_001dc780;
    iVar2 = listen(iVar1,1);
    local_158.data = (void *)(long)iVar2;
    local_210.data = (void *)0x0;
    if (local_158.data != (void *)0x0) goto LAB_001dc795;
    iVar2 = uv_udp_init(loop,&local_210);
    local_158.data = (void *)(long)iVar2;
    local_2a0._0_8_ = (uv_loop_t *)0x0;
    if (local_158.data != (void *)0x0) goto LAB_001dc7aa;
    iVar2 = uv_udp_open(&local_210,iVar1);
    local_158.data = (void *)(long)iVar2;
    local_2a0._0_8_ = (uv_loop_t *)0x0;
    if (local_158.data != (void *)0x0) goto LAB_001dc7bc;
    uv_run(loop,UV_RUN_DEFAULT);
    iVar2 = uv_udp_send(&local_158,&local_210,&local_290,1,(sockaddr *)local_27e,(uv_udp_send_cb)0x0
                       );
    local_2a0._0_8_ = SEXT48(iVar2);
    local_2a0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_2a0._0_8_ == (uv_loop_t *)0x0) {
      uv_close((uv_handle_t *)&local_210,(uv_close_cb)0x0);
      uv_run(loop,UV_RUN_DEFAULT);
      close(iVar1);
      unlink("/tmp/uv-test-sock");
      uv_walk(loop,close_walk_cb,(void *)0x0);
      uv_run(loop,UV_RUN_DEFAULT);
      local_2a0._0_8_ = (uv_loop_t *)0x0;
      iVar1 = uv_loop_close(loop);
      local_2a0._8_8_ = SEXT48(iVar1);
      if (local_2a0._0_8_ == local_2a0._8_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001dc7dd;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_001dc7dd:
  handle_00 = (uv_handle_t *)local_2a0;
  run_test_udp_send_unix_cold_7();
  if (handle_00 != (uv_handle_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing(handle_00);
  if (iVar1 == 0) {
    uv_close(handle_00,(uv_close_cb)0x0);
    return extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(udp_send_unix) {
  /* Test that "uv_udp_send()" supports sending over
     a "sockaddr_un" address. */
  struct sockaddr_un addr;
  uv_udp_t handle;
  uv_udp_send_t req;
  uv_loop_t* loop;
  uv_buf_t buf = uv_buf_init("PING", 4);
  int fd;
  int r;

  loop = uv_default_loop();

  memset(&addr, 0, sizeof addr);
  addr.sun_family = AF_UNIX;
  ASSERT_LT(strlen(TEST_PIPENAME), sizeof(addr.sun_path));
  memcpy(addr.sun_path, TEST_PIPENAME, strlen(TEST_PIPENAME));

  fd = socket(AF_UNIX, SOCK_STREAM, 0);
  ASSERT_GE(fd, 0);

  unlink(TEST_PIPENAME);
  ASSERT_OK(bind(fd, (const struct sockaddr*)&addr, sizeof addr));
  ASSERT_OK(listen(fd, 1));

  r = uv_udp_init(loop, &handle);
  ASSERT_OK(r);
  r = uv_udp_open(&handle, fd);
  ASSERT_OK(r);
  uv_run(loop, UV_RUN_DEFAULT);

  r = uv_udp_send(&req,
                  &handle,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  NULL);
  ASSERT_OK(r);

  uv_close((uv_handle_t*)&handle, NULL);
  uv_run(loop, UV_RUN_DEFAULT);
  close(fd);
  unlink(TEST_PIPENAME);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}